

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O2

void __thiscall
DIS::EntityDamageStatusPdu::marshal(EntityDamageStatusPdu *this,DataStream *dataStream)

{
  pointer pDVar1;
  long lVar2;
  ulong uVar3;
  DirectedEnergyDamage x;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::marshal(&this->_damagedEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             (((long)(this->_damageDescriptionRecords).
                     super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_damageDescriptionRecords).
                    super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x60));
  lVar2 = 0x58;
  uVar3 = 0;
  while( true ) {
    pDVar1 = (this->_damageDescriptionRecords).
             super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_damageDescriptionRecords).
                       super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x60) <= uVar3)
    break;
    x._vptr_DirectedEnergyDamage = (_func_int **)&PTR__DirectedEnergyDamage_001c1158;
    x._8_8_ = *(undefined8 *)((long)pDVar1 + lVar2 + -0x50);
    x._damageLocation._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001c3790;
    x._damageLocation._z = *(float *)((long)pDVar1 + lVar2 + -0x38);
    x._damageLocation._8_8_ = *(undefined8 *)((long)pDVar1 + lVar2 + -0x40);
    x._48_4_ = *(undefined4 *)((long)pDVar1 + lVar2 + -0x28);
    x._40_8_ = *(undefined8 *)((long)pDVar1 + lVar2 + -0x30);
    x._fireEventID._vptr_EventIdentifier = (_func_int **)&PTR__EventIdentifier_001c1930;
    x._fireEventID._simulationAddress._vptr_SimulationAddress =
         (_func_int **)&PTR__SimulationAddress_001c2fb8;
    x._fireEventID._simulationAddress._8_4_ = *(undefined4 *)((long)pDVar1 + lVar2 + -0x10);
    x._fireEventID._eventNumber = *(unsigned_short *)((long)pDVar1 + lVar2 + -8);
    x._padding2 = *(unsigned_short *)((long)&pDVar1->_vptr_DirectedEnergyDamage + lVar2);
    DirectedEnergyDamage::marshal(&x,dataStream);
    DirectedEnergyDamage::~DirectedEnergyDamage(&x);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x60;
  }
  return;
}

Assistant:

void EntityDamageStatusPdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _damagedEntityID.marshal(dataStream);
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << ( unsigned short )_damageDescriptionRecords.size();

     for(size_t idx = 0; idx < _damageDescriptionRecords.size(); idx++)
     {
        DirectedEnergyDamage x = _damageDescriptionRecords[idx];
        x.marshal(dataStream);
     }

}